

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

VkResult __thiscall
VmaDeviceMemoryBlock::WriteMagicValueAfterAllocation
          (VmaDeviceMemoryBlock *this,VmaAllocator hAllocator,VkDeviceSize allocOffset,
          VkDeviceSize allocSize)

{
  VkResult VVar1;
  long in_RCX;
  long in_RDX;
  undefined8 in_RDI;
  VmaDeviceMemoryBlock *unaff_retaddr;
  uint32_t in_stack_0000000c;
  VmaAllocator in_stack_00000010;
  VkResult res;
  void *pData;
  undefined8 local_30;
  uint32_t count;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  count = (uint32_t)((ulong)in_RDI >> 0x20);
  VVar1 = Map((VmaDeviceMemoryBlock *)pData,in_stack_00000010,in_stack_0000000c,
              &unaff_retaddr->m_pMetadata);
  if (VVar1 == VK_SUCCESS) {
    VmaWriteMagicValue(local_30,in_RDX + in_RCX);
    Unmap(unaff_retaddr,(VmaAllocator)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
          count);
    VVar1 = VK_SUCCESS;
  }
  return VVar1;
}

Assistant:

VkResult VmaDeviceMemoryBlock::WriteMagicValueAfterAllocation(VmaAllocator hAllocator, VkDeviceSize allocOffset, VkDeviceSize allocSize)
{
    VMA_ASSERT(VMA_DEBUG_MARGIN > 0 && VMA_DEBUG_MARGIN % 4 == 0 && VMA_DEBUG_DETECT_CORRUPTION);

    void* pData;
    VkResult res = Map(hAllocator, 1, &pData);
    if (res != VK_SUCCESS)
    {
        return res;
    }

    VmaWriteMagicValue(pData, allocOffset + allocSize);

    Unmap(hAllocator, 1);
    return VK_SUCCESS;
}